

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::PrintTransitions(BaseTag *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined8 uVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  iVar2 = (**(code **)(*(long *)this + 0x10))();
  if (0 < iVar2) {
    uVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State ",6);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      uVar4 = (**(code **)(*(long *)this + 0x60))(this,uVar10 & 0xffffffff);
      (**(code **)(*(long *)this + 0xc0))(this,uVar4,&std::cout);
      iVar2 = (**(code **)(*(long *)this + 0x18))(this);
      if (0 < iVar2) {
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Applying action ",0x10);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," on ",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          lVar9 = *(long *)&(this->transition_probabilities_).
                            super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].
                            super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar8 = *(long *)(lVar9 + lVar7 * 0x18);
          if (*(long *)(lVar9 + 8 + lVar7 * 0x18) != lVar8) {
            lVar9 = 0xc;
            uVar6 = 0;
            do {
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)lVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
              poVar5 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar5,*(int *)(lVar8 + lVar9));
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
              poVar5 = std::ostream::_M_insert<double>(*(double *)(lVar8 + 0xc + lVar9));
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              uVar4 = (**(code **)(*(long *)this + 0x60))(this,*(undefined4 *)(lVar8 + lVar9));
              (**(code **)(*(long *)this + 0xc0))(this,uVar4,&std::cout);
              uVar6 = uVar6 + 1;
              lVar1 = *(long *)&(this->transition_probabilities_).
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data;
              lVar8 = *(long *)(lVar1 + lVar7 * 0x18);
              lVar9 = lVar9 + 0x20;
            } while (uVar6 < (ulong)(*(long *)(lVar1 + 8 + lVar7 * 0x18) - lVar8 >> 5));
          }
          lVar7 = lVar7 + 1;
          iVar2 = (**(code **)(*(long *)this + 0x18))(this);
        } while (lVar7 < iVar2);
      }
      uVar10 = uVar10 + 1;
      iVar2 = (**(code **)(*(long *)this + 0x10))(this);
    } while ((long)uVar10 < (long)iVar2);
  }
  return;
}

Assistant:

void BaseTag::PrintTransitions() const {
	for (int s = 0; s < NumStates(); s++) {
		cout << "State " << s << endl;
		PrintState(*GetState(s));
		for (int a = 0; a < NumActions(); a++) {
			cout << "Applying action " << a << " on " << endl;
			for (int i = 0; i < transition_probabilities_[s][a].size();
				i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << s << "-" << a << "-" << next.state_id << "-"
					<< next.weight << endl;
				PrintState(*GetState(next.state_id));
			}
		}
	}
}